

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f::BuildLogRecompactTestRecompact::Run(BuildLogRecompactTestRecompact *this)

{
  BuildLogUser *user;
  pointer ppEVar1;
  Test *pTVar2;
  bool bVar3;
  LogEntry *pLVar4;
  int iVar5;
  int i;
  int iVar6;
  allocator<char> local_149;
  string local_148;
  string err;
  BuildLog log3;
  BuildLog log2;
  BuildLog log1;
  
  AssertParse(&(this->super_BuildLogRecompactTest).super_BuildLogTest.
               super_StateTestWithBuiltinRules.state_,"build out: cat in\nbuild out2: cat in\n",
              (ManifestParserOptions)0x0);
  BuildLog::BuildLog(&log1);
  pTVar2 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log2,"BuildLogTest-tempfile",(allocator<char> *)&log3);
  user = &(this->super_BuildLogRecompactTest).super_BuildLogTest.super_BuildLogUser;
  bVar3 = BuildLog::OpenForWrite(&log1,(string *)&log2,user,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
             ,0x116,"log1.OpenForWrite(kTestFilename, *this, &err)");
  std::__cxx11::string::~string((string *)&log2);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x117,"\"\" == err");
  if (!bVar3) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_0011d258;
  }
  iVar6 = 0;
  iVar5 = 200;
  while( true ) {
    ppEVar1 = (this->super_BuildLogRecompactTest).super_BuildLogTest.super_StateTestWithBuiltinRules
              .state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar3 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar3) break;
    BuildLog::RecordCommand(&log1,*ppEVar1,0xf,iVar6 + 0x12,0);
    iVar6 = iVar6 + 1;
  }
  BuildLog::RecordCommand(&log1,ppEVar1[1],0x15,0x16,0);
  BuildLog::Close(&log1);
  BuildLog::BuildLog(&log2);
  pTVar2 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log3,"BuildLogTest-tempfile",(allocator<char> *)&local_148);
  bVar3 = BuildLog::Load(&log2,(string *)&log3,&err);
  testing::Test::Check
            (pTVar2,bVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
             ,0x121,"log2.Load(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&log3);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&err);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x122,"\"\" == err");
  if (bVar3) {
    bVar3 = testing::Test::Check
                      (g_current_test,log2.entries_._M_h._M_element_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                       ,0x123,"2u == log2.entries().size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log3,"out",(allocator<char> *)&local_148);
      pLVar4 = BuildLog::LookupByOutput(&log2,(string *)&log3);
      bVar3 = testing::Test::Check
                        (pTVar2,pLVar4 != (LogEntry *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                         ,0x124,"log2.LookupByOutput(\"out\")");
      std::__cxx11::string::~string((string *)&log3);
      pTVar2 = g_current_test;
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log3,"out2",(allocator<char> *)&local_148);
        pLVar4 = BuildLog::LookupByOutput(&log2,(string *)&log3);
        bVar3 = testing::Test::Check
                          (pTVar2,pLVar4 != (LogEntry *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                           ,0x125,"log2.LookupByOutput(\"out2\")");
        std::__cxx11::string::~string((string *)&log3);
        pTVar2 = g_current_test;
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&log3,"BuildLogTest-tempfile",(allocator<char> *)&local_148);
          bVar3 = BuildLog::OpenForWrite(&log2,(string *)&log3,user,&err);
          testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,0x127,"log2.OpenForWrite(kTestFilename, *this, &err)");
          std::__cxx11::string::~string((string *)&log3);
          BuildLog::Close(&log2);
          BuildLog::BuildLog(&log3);
          pTVar2 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"BuildLogTest-tempfile",&local_149);
          bVar3 = BuildLog::Load(&log2,&local_148,&err);
          testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                     ,300,"log2.Load(kTestFilename, &err)");
          std::__cxx11::string::~string((string *)&local_148);
          pTVar2 = g_current_test;
          bVar3 = std::operator==("",&err);
          bVar3 = testing::Test::Check
                            (pTVar2,bVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                             ,0x12d,"\"\" == err");
          if ((bVar3) &&
             (bVar3 = testing::Test::Check
                                (g_current_test,log2.entries_._M_h._M_element_count == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                                 ,0x12e,"1u == log2.entries().size()"), pTVar2 = g_current_test,
             bVar3)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"out",&local_149);
            pLVar4 = BuildLog::LookupByOutput(&log2,&local_148);
            bVar3 = testing::Test::Check
                              (pTVar2,pLVar4 != (LogEntry *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                               ,0x12f,"log2.LookupByOutput(\"out\")");
            std::__cxx11::string::~string((string *)&local_148);
            pTVar2 = g_current_test;
            if (!bVar3) goto LAB_0011d233;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"out2",&local_149);
            pLVar4 = BuildLog::LookupByOutput(&log2,&local_148);
            bVar3 = testing::Test::Check
                              (pTVar2,pLVar4 == (LogEntry *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_log_test.cc"
                               ,0x130,"log2.LookupByOutput(\"out2\")");
            std::__cxx11::string::~string((string *)&local_148);
            if (!bVar3) goto LAB_0011d233;
          }
          else {
LAB_0011d233:
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          BuildLog::~BuildLog(&log3);
          goto LAB_0011d24b;
        }
      }
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_0011d24b:
  BuildLog::~BuildLog(&log2);
LAB_0011d258:
  std::__cxx11::string::~string((string *)&err);
  BuildLog::~BuildLog(&log1);
  return;
}

Assistant:

TEST_F(BuildLogRecompactTest, Recompact) {
  AssertParse(&state_,
"build out: cat in\n"
"build out2: cat in\n");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  // Record the same edge several times, to trigger recompaction
  // the next time the log is opened.
  for (int i = 0; i < 200; ++i)
    log1.RecordCommand(state_.edges_[0], 15, 18 + i);
  log1.RecordCommand(state_.edges_[1], 21, 22);
  log1.Close();

  // Load...
  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));
  // ...and force a recompaction.
  EXPECT_TRUE(log2.OpenForWrite(kTestFilename, *this, &err));
  log2.Close();

  // "out2" is dead, it should've been removed.
  BuildLog log3;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out"));
  ASSERT_FALSE(log2.LookupByOutput("out2"));
}